

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

spv_result_t
anon_unknown.dwarf_23f2ee::encodeImmediate
          (AssemblyContext *context,char *text,spv_instruction_t *pInst)

{
  bool bVar1;
  size_t sVar2;
  uint32_t parse_result;
  DiagnosticStream local_1f8;
  
  if (*text == '!') {
    bVar1 = spvtools::utils::ParseNumber<unsigned_int>(text + 1,&parse_result);
    if (bVar1) {
      spvtools::AssemblyContext::binaryEncodeU32(context,parse_result,pInst);
      sVar2 = strlen(text);
      spvtools::AssemblyContext::seekForward(context,(uint32_t)sVar2);
      local_1f8.error_ = SPV_SUCCESS;
    }
    else {
      spvtools::AssemblyContext::diagnostic(&local_1f8,context,SPV_ERROR_INVALID_TEXT);
      std::operator<<((ostream *)&local_1f8,"Invalid immediate integer: !");
      std::operator<<((ostream *)&local_1f8,text + 1);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_1f8);
    }
    return local_1f8.error_;
  }
  __assert_fail("*text == \'!\'",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                ,0xa4,
                "spv_result_t (anonymous namespace)::encodeImmediate(spvtools::AssemblyContext *, const char *, spv_instruction_t *)"
               );
}

Assistant:

spv_result_t encodeImmediate(spvtools::AssemblyContext* context,
                             const char* text, spv_instruction_t* pInst) {
  assert(*text == '!');
  uint32_t parse_result;
  if (!spvtools::utils::ParseNumber(text + 1, &parse_result)) {
    return context->diagnostic(SPV_ERROR_INVALID_TEXT)
           << "Invalid immediate integer: !" << text + 1;
  }
  context->binaryEncodeU32(parse_result, pInst);
  context->seekForward(static_cast<uint32_t>(strlen(text)));
  return SPV_SUCCESS;
}